

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_tester.cc
# Opt level: O1

void __thiscall
google::protobuf::MapReflectionTester::SetMapFieldsViaMapReflection
          (MapReflectionTester *this,Message *message)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  FieldDescriptor *pFVar3;
  Message *pMVar4;
  Reflection *this_00;
  pointer *__ptr;
  char *in_R9;
  pointer *__ptr_1;
  pointer *__ptr_60;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  string_view name_08;
  string_view name_09;
  string_view name_10;
  string_view name_11;
  string_view name_12;
  string_view name_13;
  string_view name_14;
  string_view name_15;
  string_view name_16;
  string_view name_17;
  string_view value;
  string_view name_18;
  string_view name_19;
  string_view value_00;
  string_view name_20;
  string_view name_21;
  string_view name_22;
  string_view name_23;
  string_view name_24;
  string_view name_25;
  string_view name_26;
  string_view name_27;
  string_view name_28;
  string_view name_29;
  string_view name_30;
  string_view name_31;
  string_view name_32;
  string_view name_33;
  string_view name_34;
  string_view name_35;
  string_view name_36;
  string_view name_37;
  string_view name_38;
  string_view name_39;
  string_view value_01;
  string_view name_40;
  string_view value_02;
  string_view name_41;
  string_view name_42;
  Metadata MVar5;
  AssertionResult gtest_ar_;
  MapValueRef map_val;
  MapValueConstRef map_val_const;
  string map_key_string;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c8;
  AssertHelper local_c0;
  size_type local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  string local_a8;
  KeyValue local_88;
  undefined4 local_78;
  MapValueRef local_70;
  MapValueConstRef local_60;
  char *local_50;
  ulong local_48;
  char local_40;
  undefined7 uStack_3f;
  
  MVar5 = Message::GetMetadata(message);
  this_00 = MVar5.reflection;
  local_70.super_MapValueConstRef.data_ = (void *)0x0;
  local_70.super_MapValueConstRef.type_ = 0;
  local_60.data_ = (void *)0x0;
  local_60.type_ = 0;
  local_50 = &local_40;
  local_48 = 0;
  local_40 = '\0';
  local_78 = 1;
  local_88.string_value._M_len = (ulong)(uint)local_88.string_value._M_len._4_4_ << 0x20;
  name._M_str = "map_int32_int32";
  name._M_len = 0xf;
  pFVar3 = F(this,name);
  bVar2 = Reflection::LookupMapValue
                    (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_60);
  local_b8 = CONCAT71(local_b8._1_7_,!bVar2);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)&local_b8,
               (AssertionResult *)
               "reflection->LookupMapValue(*message, F(\"map_int32_int32\"), map_key, &map_val_const)"
               ,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x19a,local_a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  name_00._M_str = "map_int32_int32";
  name_00._M_len = 0xf;
  pFVar3 = F(this,name_00);
  bVar2 = Reflection::InsertOrLookupMapValue
                    (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_70);
  local_b8 = CONCAT71(local_b8._1_7_,bVar2);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)&local_b8,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue(message, F(\"map_int32_int32\"), map_key, &map_val)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x19c,local_a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  MapValueRef::SetInt32Value(&local_70,0);
  local_78 = 2;
  local_88.string_value._M_len = 0;
  name_01._M_str = "map_int64_int64";
  name_01._M_len = 0xf;
  pFVar3 = F(this,name_01);
  bVar2 = Reflection::LookupMapValue
                    (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_60);
  local_b8 = CONCAT71(local_b8._1_7_,!bVar2);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)&local_b8,
               (AssertionResult *)
               "reflection->LookupMapValue(*message, F(\"map_int64_int64\"), map_key, &map_val_const)"
               ,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1a1,local_a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  name_02._M_str = "map_int64_int64";
  name_02._M_len = 0xf;
  pFVar3 = F(this,name_02);
  bVar2 = Reflection::InsertOrLookupMapValue
                    (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_70);
  local_b8 = CONCAT71(local_b8._1_7_,bVar2);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)&local_b8,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue(message, F(\"map_int64_int64\"), map_key, &map_val)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1a3,local_a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  MapValueRef::SetInt64Value(&local_70,0);
  local_78 = 3;
  local_88.string_value._M_len = local_88.string_value._M_len & 0xffffffff00000000;
  name_03._M_str = "map_uint32_uint32";
  name_03._M_len = 0x11;
  pFVar3 = F(this,name_03);
  bVar2 = Reflection::LookupMapValue
                    (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_60);
  local_b8 = CONCAT71(local_b8._1_7_,!bVar2);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)&local_b8,
               (AssertionResult *)
               "reflection->LookupMapValue(*message, F(\"map_uint32_uint32\"), map_key, &map_val_const)"
               ,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1a8,local_a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  name_04._M_str = "map_uint32_uint32";
  name_04._M_len = 0x11;
  pFVar3 = F(this,name_04);
  bVar2 = Reflection::InsertOrLookupMapValue
                    (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_70);
  local_b8 = CONCAT71(local_b8._1_7_,bVar2);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)&local_b8,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue( message, F(\"map_uint32_uint32\"), map_key, &map_val)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1aa,local_a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  MapValueRef::SetUInt32Value(&local_70,0);
  local_78 = 4;
  local_88.string_value._M_len = 0;
  name_05._M_str = "map_uint64_uint64";
  name_05._M_len = 0x11;
  pFVar3 = F(this,name_05);
  bVar2 = Reflection::InsertOrLookupMapValue
                    (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_70);
  local_b8 = CONCAT71(local_b8._1_7_,bVar2);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)&local_b8,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue( message, F(\"map_uint64_uint64\"), map_key, &map_val)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1af,local_a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  MapValueRef::SetUInt64Value(&local_70,0);
  local_78 = 1;
  local_88.string_value._M_len = local_88.string_value._M_len & 0xffffffff00000000;
  name_06._M_str = "map_sint32_sint32";
  name_06._M_len = 0x11;
  pFVar3 = F(this,name_06);
  bVar2 = Reflection::InsertOrLookupMapValue
                    (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_70);
  local_b8 = CONCAT71(local_b8._1_7_,bVar2);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)&local_b8,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue( message, F(\"map_sint32_sint32\"), map_key, &map_val)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1b4,local_a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  MapValueRef::SetInt32Value(&local_70,0);
  local_78 = 2;
  local_88.string_value._M_len = 0;
  name_07._M_str = "map_sint64_sint64";
  name_07._M_len = 0x11;
  pFVar3 = F(this,name_07);
  bVar2 = Reflection::InsertOrLookupMapValue
                    (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_70);
  local_b8 = CONCAT71(local_b8._1_7_,bVar2);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)&local_b8,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue( message, F(\"map_sint64_sint64\"), map_key, &map_val)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1b9,local_a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  MapValueRef::SetInt64Value(&local_70,0);
  local_78 = 3;
  local_88.string_value._M_len = local_88.string_value._M_len & 0xffffffff00000000;
  name_08._M_str = "map_fixed32_fixed32";
  name_08._M_len = 0x13;
  pFVar3 = F(this,name_08);
  bVar2 = Reflection::InsertOrLookupMapValue
                    (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_70);
  local_b8 = CONCAT71(local_b8._1_7_,bVar2);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)&local_b8,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue( message, F(\"map_fixed32_fixed32\"), map_key, &map_val)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1be,local_a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  MapValueRef::SetUInt32Value(&local_70,0);
  local_78 = 4;
  local_88.string_value._M_len = 0;
  name_09._M_str = "map_fixed64_fixed64";
  name_09._M_len = 0x13;
  pFVar3 = F(this,name_09);
  bVar2 = Reflection::InsertOrLookupMapValue
                    (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_70);
  local_b8 = CONCAT71(local_b8._1_7_,bVar2);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)&local_b8,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue( message, F(\"map_fixed64_fixed64\"), map_key, &map_val)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1c3,local_a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  MapValueRef::SetUInt64Value(&local_70,0);
  local_78 = 1;
  local_88.string_value._M_len = local_88.string_value._M_len & 0xffffffff00000000;
  name_10._M_str = "map_sfixed32_sfixed32";
  name_10._M_len = 0x15;
  pFVar3 = F(this,name_10);
  bVar2 = Reflection::InsertOrLookupMapValue
                    (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_70);
  local_b8 = CONCAT71(local_b8._1_7_,bVar2);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)&local_b8,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue( message, F(\"map_sfixed32_sfixed32\"), map_key, &map_val)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1c8,local_a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  MapValueRef::SetInt32Value(&local_70,0);
  local_78 = 2;
  local_88.string_value._M_len = 0;
  name_11._M_str = "map_sfixed64_sfixed64";
  name_11._M_len = 0x15;
  pFVar3 = F(this,name_11);
  bVar2 = Reflection::InsertOrLookupMapValue
                    (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_70);
  local_b8 = CONCAT71(local_b8._1_7_,bVar2);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)&local_b8,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue( message, F(\"map_sfixed64_sfixed64\"), map_key, &map_val)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1cd,local_a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  MapValueRef::SetInt64Value(&local_70,0);
  local_78 = 1;
  local_88.string_value._M_len = local_88.string_value._M_len & 0xffffffff00000000;
  name_12._M_str = "map_int32_float";
  name_12._M_len = 0xf;
  pFVar3 = F(this,name_12);
  bVar2 = Reflection::InsertOrLookupMapValue
                    (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_70);
  local_b8 = CONCAT71(local_b8._1_7_,bVar2);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)&local_b8,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue(message, F(\"map_int32_float\"), map_key, &map_val)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1d2,local_a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  MapValueRef::SetFloatValue(&local_70,0.0);
  local_78 = 1;
  local_88.string_value._M_len = local_88.string_value._M_len & 0xffffffff00000000;
  name_13._M_str = "map_int32_double";
  name_13._M_len = 0x10;
  pFVar3 = F(this,name_13);
  bVar2 = Reflection::InsertOrLookupMapValue
                    (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_70);
  local_b8 = CONCAT71(local_b8._1_7_,bVar2);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)&local_b8,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue(message, F(\"map_int32_double\"), map_key, &map_val)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1d7,local_a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  MapValueRef::SetDoubleValue(&local_70,0.0);
  local_78 = 7;
  local_88.string_value._M_len = local_88.string_value._M_len & 0xffffffffffffff00;
  name_14._M_str = "map_bool_bool";
  name_14._M_len = 0xd;
  pFVar3 = F(this,name_14);
  bVar2 = Reflection::LookupMapValue
                    (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_60);
  local_b8 = CONCAT71(local_b8._1_7_,!bVar2);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)&local_b8,
               (AssertionResult *)
               "reflection->LookupMapValue(*message, F(\"map_bool_bool\"), map_key, &map_val_const)"
               ,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1dc,local_a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  name_15._M_str = "map_bool_bool";
  name_15._M_len = 0xd;
  pFVar3 = F(this,name_15);
  bVar2 = Reflection::InsertOrLookupMapValue
                    (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_70);
  local_b8 = CONCAT71(local_b8._1_7_,bVar2);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)&local_b8,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue(message, F(\"map_bool_bool\"), map_key, &map_val)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1de,local_a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  MapValueRef::SetBoolValue(&local_70,false);
  paVar1 = &local_a8.field_2;
  local_b8 = 0x30;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  local_a8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_a8,(ulong)&local_b8);
  local_a8.field_2._M_allocated_capacity = local_b8;
  builtin_strncpy(local_a8._M_dataplus._M_p,"This is a very long string that goes in the heap",0x30)
  ;
  local_a8._M_string_length = local_b8;
  local_a8._M_dataplus._M_p[local_b8] = '\0';
  std::__cxx11::string::operator=((string *)&local_50,(string *)&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  local_78 = 9;
  local_88.string_value._M_len = local_48;
  local_88.string_value._M_str = local_50;
  name_16._M_str = "map_string_string";
  name_16._M_len = 0x11;
  pFVar3 = F(this,name_16);
  bVar2 = Reflection::LookupMapValue
                    (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_60);
  local_b8 = CONCAT71(local_b8._1_7_,!bVar2);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)&local_b8,
               (AssertionResult *)
               "reflection->LookupMapValue(*message, F(\"map_string_string\"), map_key, &map_val_const)"
               ,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1e4,local_a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  name_17._M_str = "map_string_string";
  name_17._M_len = 0x11;
  pFVar3 = F(this,name_17);
  bVar2 = Reflection::InsertOrLookupMapValue
                    (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_70);
  local_b8 = CONCAT71(local_b8._1_7_,bVar2);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)&local_b8,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue( message, F(\"map_string_string\"), map_key, &map_val)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1e6,local_a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  local_b8 = 0x30;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  local_a8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_a8,(ulong)&local_b8);
  local_a8.field_2._M_allocated_capacity = local_b8;
  builtin_strncpy(local_a8._M_dataplus._M_p,"This is a very long string that goes in the heap",0x30)
  ;
  local_a8._M_string_length = local_b8;
  local_a8._M_dataplus._M_p[local_b8] = '\0';
  value._M_str = local_a8._M_dataplus._M_p;
  value._M_len = local_b8;
  MapValueRef::SetStringValue(&local_70,value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  local_78 = 1;
  local_88.string_value._M_len = local_88.string_value._M_len & 0xffffffff00000000;
  name_18._M_str = "map_int32_bytes";
  name_18._M_len = 0xf;
  pFVar3 = F(this,name_18);
  bVar2 = Reflection::LookupMapValue
                    (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_60);
  local_b8 = CONCAT71(local_b8._1_7_,!bVar2);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)&local_b8,
               (AssertionResult *)
               "reflection->LookupMapValue(*message, F(\"map_int32_bytes\"), map_key, &map_val_const)"
               ,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1eb,local_a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  name_19._M_str = "map_int32_bytes";
  name_19._M_len = 0xf;
  pFVar3 = F(this,name_19);
  bVar2 = Reflection::InsertOrLookupMapValue
                    (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_70);
  local_b8 = CONCAT71(local_b8._1_7_,bVar2);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)&local_b8,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue(message, F(\"map_int32_bytes\"), map_key, &map_val)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1ed,local_a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  local_b8 = 0x30;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  local_a8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_a8,(ulong)&local_b8);
  local_a8.field_2._M_allocated_capacity = local_b8;
  builtin_strncpy(local_a8._M_dataplus._M_p,"This is a very long string that goes in the heap",0x30)
  ;
  local_a8._M_string_length = local_b8;
  local_a8._M_dataplus._M_p[local_b8] = '\0';
  value_00._M_str = local_a8._M_dataplus._M_p;
  value_00._M_len = local_b8;
  MapValueRef::SetStringValue(&local_70,value_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  local_78 = 1;
  local_88.string_value._M_len = local_88.string_value._M_len & 0xffffffff00000000;
  name_20._M_str = "map_int32_enum";
  name_20._M_len = 0xe;
  pFVar3 = F(this,name_20);
  bVar2 = Reflection::LookupMapValue
                    (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_60);
  local_b8 = CONCAT71(local_b8._1_7_,!bVar2);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)&local_b8,
               (AssertionResult *)
               "reflection->LookupMapValue(*message, F(\"map_int32_enum\"), map_key, &map_val_const)"
               ,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1f2,local_a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  name_21._M_str = "map_int32_enum";
  name_21._M_len = 0xe;
  pFVar3 = F(this,name_21);
  bVar2 = Reflection::InsertOrLookupMapValue
                    (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_70);
  local_b8 = CONCAT71(local_b8._1_7_,bVar2);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)&local_b8,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue(message, F(\"map_int32_enum\"), map_key, &map_val)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,500,local_a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  MapValueRef::SetEnumValue(&local_70,this->map_enum_bar_->number_);
  local_78 = 1;
  local_88.string_value._M_len = local_88.string_value._M_len & 0xffffffff00000000;
  name_22._M_str = "map_int32_foreign_message";
  name_22._M_len = 0x19;
  pFVar3 = F(this,name_22);
  bVar2 = Reflection::LookupMapValue
                    (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_60);
  local_b8 = CONCAT71(local_b8._1_7_,!bVar2);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)&local_b8,
               (AssertionResult *)
               "reflection->LookupMapValue( *message, F(\"map_int32_foreign_message\"), map_key, &map_val_const)"
               ,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1f9,local_a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  name_23._M_str = "map_int32_foreign_message";
  name_23._M_len = 0x19;
  pFVar3 = F(this,name_23);
  bVar2 = Reflection::InsertOrLookupMapValue
                    (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_70);
  local_b8 = CONCAT71(local_b8._1_7_,bVar2);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)&local_b8,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue( message, F(\"map_int32_foreign_message\"), map_key, &map_val)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x1fb,local_a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  pMVar4 = MapValueRef::MutableMessageValue(&local_70);
  MVar5 = Message::GetMetadata(pMVar4);
  Reflection::SetInt32(MVar5.reflection,pMVar4,this->foreign_c_,0);
  local_78 = 1;
  local_88.int32_value = 1;
  name_24._M_str = "map_int32_int32";
  name_24._M_len = 0xf;
  pFVar3 = F(this,name_24);
  bVar2 = Reflection::InsertOrLookupMapValue
                    (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_70);
  local_b8 = CONCAT71(local_b8._1_7_,bVar2);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)&local_b8,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue(message, F(\"map_int32_int32\"), map_key, &map_val)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x203,local_a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  MapValueRef::SetInt32Value(&local_70,1);
  name_25._M_str = "map_int32_int32";
  name_25._M_len = 0xf;
  pFVar3 = F(this,name_25);
  bVar2 = Reflection::InsertOrLookupMapValue
                    (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_70);
  local_b8 = CONCAT71(local_b8._1_7_,!bVar2);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)&local_b8,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue(message, F(\"map_int32_int32\"), map_key, &map_val)"
               ,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x206,local_a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  local_78 = 2;
  local_88.string_value._M_len = 1;
  name_26._M_str = "map_int64_int64";
  name_26._M_len = 0xf;
  pFVar3 = F(this,name_26);
  bVar2 = Reflection::InsertOrLookupMapValue
                    (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_70);
  local_b8 = CONCAT71(local_b8._1_7_,bVar2);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)&local_b8,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue(message, F(\"map_int64_int64\"), map_key, &map_val)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x20a,local_a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  MapValueRef::SetInt64Value(&local_70,1);
  name_27._M_str = "map_int64_int64";
  name_27._M_len = 0xf;
  pFVar3 = F(this,name_27);
  bVar2 = Reflection::InsertOrLookupMapValue
                    (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_70);
  local_b8 = CONCAT71(local_b8._1_7_,!bVar2);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)&local_b8,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue(message, F(\"map_int64_int64\"), map_key, &map_val)"
               ,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x20d,local_a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  local_78 = 3;
  local_88.int32_value = 1;
  name_28._M_str = "map_uint32_uint32";
  name_28._M_len = 0x11;
  pFVar3 = F(this,name_28);
  Reflection::InsertOrLookupMapValue
            (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_70);
  MapValueRef::SetUInt32Value(&local_70,1);
  local_78 = 4;
  local_88.string_value._M_len = 1;
  name_29._M_str = "map_uint64_uint64";
  name_29._M_len = 0x11;
  pFVar3 = F(this,name_29);
  Reflection::InsertOrLookupMapValue
            (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_70);
  MapValueRef::SetUInt64Value(&local_70,1);
  local_78 = 1;
  local_88.int32_value = 1;
  name_30._M_str = "map_sint32_sint32";
  name_30._M_len = 0x11;
  pFVar3 = F(this,name_30);
  Reflection::InsertOrLookupMapValue
            (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_70);
  MapValueRef::SetInt32Value(&local_70,1);
  local_78 = 2;
  local_88.string_value._M_len = 1;
  name_31._M_str = "map_sint64_sint64";
  name_31._M_len = 0x11;
  pFVar3 = F(this,name_31);
  Reflection::InsertOrLookupMapValue
            (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_70);
  MapValueRef::SetInt64Value(&local_70,1);
  local_78 = 3;
  local_88.int32_value = 1;
  name_32._M_str = "map_fixed32_fixed32";
  name_32._M_len = 0x13;
  pFVar3 = F(this,name_32);
  Reflection::InsertOrLookupMapValue
            (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_70);
  MapValueRef::SetUInt32Value(&local_70,1);
  local_78 = 4;
  local_88.string_value._M_len = 1;
  name_33._M_str = "map_fixed64_fixed64";
  name_33._M_len = 0x13;
  pFVar3 = F(this,name_33);
  Reflection::InsertOrLookupMapValue
            (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_70);
  MapValueRef::SetUInt64Value(&local_70,1);
  local_78 = 1;
  local_88.int32_value = 1;
  name_34._M_str = "map_sfixed32_sfixed32";
  name_34._M_len = 0x15;
  pFVar3 = F(this,name_34);
  Reflection::InsertOrLookupMapValue
            (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_70);
  MapValueRef::SetInt32Value(&local_70,1);
  local_78 = 2;
  local_88.string_value._M_len = 1;
  name_35._M_str = "map_sfixed64_sfixed64";
  name_35._M_len = 0x15;
  pFVar3 = F(this,name_35);
  Reflection::InsertOrLookupMapValue
            (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_70);
  MapValueRef::SetInt64Value(&local_70,1);
  local_78 = 1;
  local_88.int32_value = 1;
  name_36._M_str = "map_int32_float";
  name_36._M_len = 0xf;
  pFVar3 = F(this,name_36);
  Reflection::InsertOrLookupMapValue
            (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_70);
  MapValueRef::SetFloatValue(&local_70,1.0);
  local_78 = 1;
  local_88.int32_value = 1;
  name_37._M_str = "map_int32_double";
  name_37._M_len = 0x10;
  pFVar3 = F(this,name_37);
  Reflection::InsertOrLookupMapValue
            (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_70);
  MapValueRef::SetDoubleValue(&local_70,1.0);
  local_78 = 7;
  local_88.bool_value = (bool)1;
  name_38._M_str = "map_bool_bool";
  name_38._M_len = 0xd;
  pFVar3 = F(this,name_38);
  Reflection::InsertOrLookupMapValue
            (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_70);
  MapValueRef::SetBoolValue(&local_70,true);
  local_b8 = 0x36;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  local_a8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_a8,(ulong)&local_b8);
  local_a8.field_2._M_allocated_capacity = local_b8;
  builtin_strncpy(local_a8._M_dataplus._M_p,"This is another very long string that goes in the heap"
                  ,0x36);
  local_a8._M_string_length = local_b8;
  local_a8._M_dataplus._M_p[local_b8] = '\0';
  std::__cxx11::string::operator=((string *)&local_50,(string *)&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  local_78 = 9;
  local_88.string_value._M_len = local_48;
  local_88.string_value._M_str = local_50;
  name_39._M_str = "map_string_string";
  name_39._M_len = 0x11;
  pFVar3 = F(this,name_39);
  Reflection::InsertOrLookupMapValue
            (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_70);
  local_b8 = 0x36;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  local_a8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_a8,(ulong)&local_b8);
  local_a8.field_2._M_allocated_capacity = local_b8;
  builtin_strncpy(local_a8._M_dataplus._M_p,"This is another very long string that goes in the heap"
                  ,0x36);
  local_a8._M_string_length = local_b8;
  local_a8._M_dataplus._M_p[local_b8] = '\0';
  value_01._M_str = local_a8._M_dataplus._M_p;
  value_01._M_len = local_b8;
  MapValueRef::SetStringValue(&local_70,value_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  local_78 = 1;
  local_88.int32_value = 1;
  name_40._M_str = "map_int32_bytes";
  name_40._M_len = 0xf;
  pFVar3 = F(this,name_40);
  Reflection::InsertOrLookupMapValue
            (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_70);
  local_b8 = 0x36;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  local_a8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_a8,(ulong)&local_b8);
  local_a8.field_2._M_allocated_capacity = local_b8;
  builtin_strncpy(local_a8._M_dataplus._M_p,"This is another very long string that goes in the heap"
                  ,0x36);
  local_a8._M_string_length = local_b8;
  local_a8._M_dataplus._M_p[local_b8] = '\0';
  value_02._M_str = local_a8._M_dataplus._M_p;
  value_02._M_len = local_b8;
  MapValueRef::SetStringValue(&local_70,value_02);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  local_78 = 1;
  local_88.int32_value = 1;
  name_41._M_str = "map_int32_enum";
  name_41._M_len = 0xe;
  pFVar3 = F(this,name_41);
  Reflection::InsertOrLookupMapValue
            (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_70);
  MapValueRef::SetEnumValue(&local_70,this->map_enum_baz_->number_);
  local_78 = 1;
  local_88.int32_value = 1;
  name_42._M_str = "map_int32_foreign_message";
  name_42._M_len = 0x19;
  pFVar3 = F(this,name_42);
  bVar2 = Reflection::InsertOrLookupMapValue
                    (this_00,message,pFVar3,(MapKey *)&local_88.string_value,&local_70);
  local_b8 = CONCAT71(local_b8._1_7_,bVar2);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)&local_b8,
               (AssertionResult *)
               "reflection->InsertOrLookupMapValue( message, F(\"map_int32_foreign_message\"), map_key, &map_val)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,600,local_a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  pMVar4 = MapValueRef::MutableMessageValue(&local_70);
  MVar5 = Message::GetMetadata(pMVar4);
  Reflection::SetInt32(MVar5.reflection,pMVar4,this->foreign_c_,1);
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return;
}

Assistant:

void MapReflectionTester::SetMapFieldsViaMapReflection(Message* message) {
  const Reflection* reflection = message->GetReflection();

  Message* sub_foreign_message = nullptr;
  MapValueRef map_val;
  MapValueConstRef map_val_const;

  // Add first element.
  std::string map_key_string;
  MapKey map_key;
  map_key.SetInt32Value(0);
  EXPECT_FALSE(reflection->LookupMapValue(*message, F("map_int32_int32"),
                                          map_key, &map_val_const));
  EXPECT_TRUE(reflection->InsertOrLookupMapValue(message, F("map_int32_int32"),
                                                 map_key, &map_val));
  map_val.SetInt32Value(0);

  map_key.SetInt64Value(0);
  EXPECT_FALSE(reflection->LookupMapValue(*message, F("map_int64_int64"),
                                          map_key, &map_val_const));
  EXPECT_TRUE(reflection->InsertOrLookupMapValue(message, F("map_int64_int64"),
                                                 map_key, &map_val));
  map_val.SetInt64Value(0);

  map_key.SetUInt32Value(0);
  EXPECT_FALSE(reflection->LookupMapValue(*message, F("map_uint32_uint32"),
                                          map_key, &map_val_const));
  EXPECT_TRUE(reflection->InsertOrLookupMapValue(
      message, F("map_uint32_uint32"), map_key, &map_val));
  map_val.SetUInt32Value(0);

  map_key.SetUInt64Value(0);
  EXPECT_TRUE(reflection->InsertOrLookupMapValue(
      message, F("map_uint64_uint64"), map_key, &map_val));
  map_val.SetUInt64Value(0);

  map_key.SetInt32Value(0);
  EXPECT_TRUE(reflection->InsertOrLookupMapValue(
      message, F("map_sint32_sint32"), map_key, &map_val));
  map_val.SetInt32Value(0);

  map_key.SetInt64Value(0);
  EXPECT_TRUE(reflection->InsertOrLookupMapValue(
      message, F("map_sint64_sint64"), map_key, &map_val));
  map_val.SetInt64Value(0);

  map_key.SetUInt32Value(0);
  EXPECT_TRUE(reflection->InsertOrLookupMapValue(
      message, F("map_fixed32_fixed32"), map_key, &map_val));
  map_val.SetUInt32Value(0);

  map_key.SetUInt64Value(0);
  EXPECT_TRUE(reflection->InsertOrLookupMapValue(
      message, F("map_fixed64_fixed64"), map_key, &map_val));
  map_val.SetUInt64Value(0);

  map_key.SetInt32Value(0);
  EXPECT_TRUE(reflection->InsertOrLookupMapValue(
      message, F("map_sfixed32_sfixed32"), map_key, &map_val));
  map_val.SetInt32Value(0);

  map_key.SetInt64Value(0);
  EXPECT_TRUE(reflection->InsertOrLookupMapValue(
      message, F("map_sfixed64_sfixed64"), map_key, &map_val));
  map_val.SetInt64Value(0);

  map_key.SetInt32Value(0);
  EXPECT_TRUE(reflection->InsertOrLookupMapValue(message, F("map_int32_float"),
                                                 map_key, &map_val));
  map_val.SetFloatValue(0.0);

  map_key.SetInt32Value(0);
  EXPECT_TRUE(reflection->InsertOrLookupMapValue(message, F("map_int32_double"),
                                                 map_key, &map_val));
  map_val.SetDoubleValue(0.0);

  map_key.SetBoolValue(false);
  EXPECT_FALSE(reflection->LookupMapValue(*message, F("map_bool_bool"), map_key,
                                          &map_val_const));
  EXPECT_TRUE(reflection->InsertOrLookupMapValue(message, F("map_bool_bool"),
                                                 map_key, &map_val));
  map_val.SetBoolValue(false);

  map_key_string = long_string();
  map_key.SetStringValue(map_key_string);
  EXPECT_FALSE(reflection->LookupMapValue(*message, F("map_string_string"),
                                          map_key, &map_val_const));
  EXPECT_TRUE(reflection->InsertOrLookupMapValue(
      message, F("map_string_string"), map_key, &map_val));
  map_val.SetStringValue(long_string());

  map_key.SetInt32Value(0);
  EXPECT_FALSE(reflection->LookupMapValue(*message, F("map_int32_bytes"),
                                          map_key, &map_val_const));
  EXPECT_TRUE(reflection->InsertOrLookupMapValue(message, F("map_int32_bytes"),
                                                 map_key, &map_val));
  map_val.SetStringValue(long_string());

  map_key.SetInt32Value(0);
  EXPECT_FALSE(reflection->LookupMapValue(*message, F("map_int32_enum"),
                                          map_key, &map_val_const));
  EXPECT_TRUE(reflection->InsertOrLookupMapValue(message, F("map_int32_enum"),
                                                 map_key, &map_val));
  map_val.SetEnumValue(map_enum_bar_->number());

  map_key.SetInt32Value(0);
  EXPECT_FALSE(reflection->LookupMapValue(
      *message, F("map_int32_foreign_message"), map_key, &map_val_const));
  EXPECT_TRUE(reflection->InsertOrLookupMapValue(
      message, F("map_int32_foreign_message"), map_key, &map_val));
  sub_foreign_message = map_val.MutableMessageValue();
  sub_foreign_message->GetReflection()->SetInt32(sub_foreign_message,
                                                 foreign_c_, 0);

  // Add second element
  map_key.SetInt32Value(1);
  EXPECT_TRUE(reflection->InsertOrLookupMapValue(message, F("map_int32_int32"),
                                                 map_key, &map_val));
  map_val.SetInt32Value(1);
  EXPECT_FALSE(reflection->InsertOrLookupMapValue(message, F("map_int32_int32"),
                                                  map_key, &map_val));

  map_key.SetInt64Value(1);
  EXPECT_TRUE(reflection->InsertOrLookupMapValue(message, F("map_int64_int64"),
                                                 map_key, &map_val));
  map_val.SetInt64Value(1);
  EXPECT_FALSE(reflection->InsertOrLookupMapValue(message, F("map_int64_int64"),
                                                  map_key, &map_val));

  map_key.SetUInt32Value(1);
  reflection->InsertOrLookupMapValue(message, F("map_uint32_uint32"), map_key,
                                     &map_val);
  map_val.SetUInt32Value(1);

  map_key.SetUInt64Value(1);
  reflection->InsertOrLookupMapValue(message, F("map_uint64_uint64"), map_key,
                                     &map_val);
  map_val.SetUInt64Value(1);

  map_key.SetInt32Value(1);
  reflection->InsertOrLookupMapValue(message, F("map_sint32_sint32"), map_key,
                                     &map_val);
  map_val.SetInt32Value(1);

  map_key.SetInt64Value(1);
  reflection->InsertOrLookupMapValue(message, F("map_sint64_sint64"), map_key,
                                     &map_val);
  map_val.SetInt64Value(1);

  map_key.SetUInt32Value(1);
  reflection->InsertOrLookupMapValue(message, F("map_fixed32_fixed32"), map_key,
                                     &map_val);
  map_val.SetUInt32Value(1);

  map_key.SetUInt64Value(1);
  reflection->InsertOrLookupMapValue(message, F("map_fixed64_fixed64"), map_key,
                                     &map_val);
  map_val.SetUInt64Value(1);

  map_key.SetInt32Value(1);
  reflection->InsertOrLookupMapValue(message, F("map_sfixed32_sfixed32"),
                                     map_key, &map_val);
  map_val.SetInt32Value(1);

  map_key.SetInt64Value(1);
  reflection->InsertOrLookupMapValue(message, F("map_sfixed64_sfixed64"),
                                     map_key, &map_val);
  map_val.SetInt64Value(1);

  map_key.SetInt32Value(1);
  reflection->InsertOrLookupMapValue(message, F("map_int32_float"), map_key,
                                     &map_val);
  map_val.SetFloatValue(1.0);

  map_key.SetInt32Value(1);
  reflection->InsertOrLookupMapValue(message, F("map_int32_double"), map_key,
                                     &map_val);
  map_val.SetDoubleValue(1.0);

  map_key.SetBoolValue(true);
  reflection->InsertOrLookupMapValue(message, F("map_bool_bool"), map_key,
                                     &map_val);
  map_val.SetBoolValue(true);

  map_key_string = long_string_2();
  map_key.SetStringValue(map_key_string);
  reflection->InsertOrLookupMapValue(message, F("map_string_string"), map_key,
                                     &map_val);
  map_val.SetStringValue(long_string_2());

  map_key.SetInt32Value(1);
  reflection->InsertOrLookupMapValue(message, F("map_int32_bytes"), map_key,
                                     &map_val);
  map_val.SetStringValue(long_string_2());

  map_key.SetInt32Value(1);
  reflection->InsertOrLookupMapValue(message, F("map_int32_enum"), map_key,
                                     &map_val);
  map_val.SetEnumValue(map_enum_baz_->number());

  map_key.SetInt32Value(1);
  EXPECT_TRUE(reflection->InsertOrLookupMapValue(
      message, F("map_int32_foreign_message"), map_key, &map_val));
  sub_foreign_message = map_val.MutableMessageValue();
  sub_foreign_message->GetReflection()->SetInt32(sub_foreign_message,
                                                 foreign_c_, 1);
}